

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.c
# Opt level: O0

Qiniu_HMAC * Qiniu_HMAC_New(Qiniu_Digest_Type digest_type,uchar *key,int key_len)

{
  int iVar1;
  EVP_MD_CTX *ctx;
  char *name;
  EVP_MD *type;
  EVP_PKEY *pkey_00;
  Qiniu_HMAC *hmac;
  EVP_PKEY *pkey;
  EVP_MD *md;
  EVP_MD_CTX *md_ctx;
  int key_len_local;
  uchar *key_local;
  Qiniu_HMAC *pQStack_10;
  Qiniu_Digest_Type digest_type_local;
  
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (ctx == (EVP_MD_CTX *)0x0) {
    pQStack_10 = (Qiniu_HMAC *)0x0;
  }
  else {
    iVar1 = EVP_MD_CTX_reset(ctx);
    if (iVar1 == 0) {
      EVP_MD_CTX_free(ctx);
      pQStack_10 = (Qiniu_HMAC *)0x0;
    }
    else {
      name = Qiniu_Digest_Type_To_Name(digest_type);
      type = EVP_get_digestbyname(name);
      if (type == (EVP_MD *)0x0) {
        EVP_MD_CTX_free(ctx);
        pQStack_10 = (Qiniu_HMAC *)0x0;
      }
      else {
        pkey_00 = EVP_PKEY_new_mac_key(0x357,(ENGINE *)0x0,key,key_len);
        if (pkey_00 == (EVP_PKEY *)0x0) {
          EVP_MD_CTX_free(ctx);
          pQStack_10 = (Qiniu_HMAC *)0x0;
        }
        else {
          iVar1 = EVP_DigestSignInit(ctx,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,pkey_00);
          if (iVar1 == 0) {
            EVP_MD_CTX_free(ctx);
            EVP_PKEY_free(pkey_00);
            pQStack_10 = (Qiniu_HMAC *)0x0;
          }
          else {
            pQStack_10 = (Qiniu_HMAC *)malloc(0x10);
            if (pQStack_10 == (Qiniu_HMAC *)0x0) {
              EVP_MD_CTX_free(ctx);
              EVP_PKEY_free(pkey_00);
              pQStack_10 = (Qiniu_HMAC *)0x0;
            }
            else {
              pQStack_10->md_ctx = (EVP_MD_CTX *)ctx;
              pQStack_10->pkey = (EVP_PKEY *)pkey_00;
            }
          }
        }
      }
    }
  }
  return pQStack_10;
}

Assistant:

Qiniu_HMAC *Qiniu_HMAC_New(Qiniu_Digest_Type digest_type, const unsigned char *key, int key_len)
{
	EVP_MD_CTX *md_ctx = EVP_MD_CTX_create();
	if (md_ctx == NULL) {
		return NULL;
	}
	if (EVP_MD_CTX_init(md_ctx) == 0) {
		EVP_MD_CTX_free(md_ctx);
		return NULL;
	}


	const EVP_MD* md = EVP_get_digestbyname(Qiniu_Digest_Type_To_Name(digest_type));
	if (md == NULL) {
		EVP_MD_CTX_free(md_ctx);
		return NULL;
	}
	EVP_PKEY *pkey = EVP_PKEY_new_mac_key(EVP_PKEY_HMAC, NULL, key, key_len);
	if (pkey == NULL) {
		EVP_MD_CTX_free(md_ctx);
		return NULL;
	}
	if (EVP_DigestSignInit(md_ctx, NULL, md, NULL, pkey) == 0) {
		EVP_MD_CTX_free(md_ctx);
		EVP_PKEY_free(pkey);
		return NULL;
	}
	Qiniu_HMAC *hmac = malloc(sizeof(Qiniu_HMAC));
	if (hmac == NULL) {
		EVP_MD_CTX_free(md_ctx);
		EVP_PKEY_free(pkey);
		return NULL;
	}
	hmac->md_ctx = md_ctx;
	hmac->pkey = pkey;
	return hmac;
}